

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::ByteSizeLong
          (TreeEnsembleParameters_TreeNode *this)

{
  uint uVar1;
  int iVar2;
  Type *pTVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  uint index;
  
  uVar1 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
  sVar8 = (ulong)uVar1 * 2;
  if ((ulong)uVar1 != 0) {
    index = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                         (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,index);
      if (pTVar3->evaluationindex_ == 0) {
        lVar6 = 0;
      }
      else {
        uVar5 = pTVar3->evaluationindex_ | 1;
        lVar6 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        lVar6 = (ulong)((int)lVar6 * 9 + 0x49U >> 6) + 1;
      }
      lVar7 = lVar6;
      if (pTVar3->evaluationvalue_ != 0.0) {
        lVar7 = lVar6 + 9;
      }
      if (NAN(pTVar3->evaluationvalue_)) {
        lVar7 = lVar6 + 9;
      }
      pTVar3->_cached_size_ = (int)lVar7;
      sVar8 = sVar8 + lVar7 + 1;
      index = index + 1;
    } while (uVar1 != index);
  }
  if (this->treeid_ != 0) {
    uVar5 = this->treeid_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  if (this->nodeid_ != 0) {
    uVar5 = this->nodeid_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = this->nodebehavior_;
  if (uVar1 != 0) {
    if ((int)uVar1 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar8 = sVar8 + uVar5;
  }
  sVar4 = sVar8 + 2;
  if (this->missingvaluetrackstruechild_ == false) {
    sVar4 = sVar8;
  }
  if (this->branchfeatureindex_ != 0) {
    uVar5 = this->branchfeatureindex_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  sVar8 = sVar4;
  if (this->branchfeaturevalue_ != 0.0) {
    sVar8 = sVar4 + 9;
  }
  if (NAN(this->branchfeaturevalue_)) {
    sVar8 = sVar4 + 9;
  }
  if (this->truechildnodeid_ != 0) {
    uVar5 = this->truechildnodeid_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  if (this->falsechildnodeid_ != 0) {
    uVar5 = this->falsechildnodeid_ | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar8;
  if (this->relativehitrate_ != 0.0) {
    sVar4 = sVar8 + 10;
  }
  if (NAN(this->relativehitrate_)) {
    sVar4 = sVar8 + 10;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t TreeEnsembleParameters_TreeNode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  {
    unsigned int count = this->evaluationinfo_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->evaluationinfo(i));
    }
  }

  // uint64 treeId = 1;
  if (this->treeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->treeid());
  }

  // uint64 nodeId = 2;
  if (this->nodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->nodeid());
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->nodebehavior() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->nodebehavior());
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->missingvaluetrackstruechild() != 0) {
    total_size += 1 + 1;
  }

  // uint64 branchFeatureIndex = 10;
  if (this->branchfeatureindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->branchfeatureindex());
  }

  // double branchFeatureValue = 11;
  if (this->branchfeaturevalue() != 0) {
    total_size += 1 + 8;
  }

  // uint64 trueChildNodeId = 12;
  if (this->truechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->truechildnodeid());
  }

  // uint64 falseChildNodeId = 13;
  if (this->falsechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->falsechildnodeid());
  }

  // double relativeHitRate = 30;
  if (this->relativehitrate() != 0) {
    total_size += 2 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}